

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSTSHarness.cpp
# Opt level: O3

void __thiscall BaseHarnessHandlers::printFile(BaseHarnessHandlers *this,XMLURL *url)

{
  XMLCh XVar1;
  XMLCh XVar2;
  int iVar3;
  XMLCh *pXVar4;
  long *plVar5;
  char *pcVar6;
  size_t sVar7;
  long lVar8;
  XMLCh *pXVar9;
  wchar16 *pwVar10;
  ulong uVar11;
  XMLByte buffer [256];
  StrX local_138 [33];
  
  pXVar4 = *(XMLCh **)(url + 0x48);
  if (pXVar4 == (XMLCh *)0x0) {
    xercesc_4_0::XMLURL::buildFullText();
    pXVar4 = *(XMLCh **)(url + 0x48);
  }
  pXVar9 = L"file://dummy/";
  if (pXVar4 != L"file://dummy/") {
    if (pXVar4 == (XMLCh *)0x0) {
LAB_00106c07:
      if (*pXVar9 == L'\0') {
        return;
      }
    }
    else {
      pXVar9 = L"file://dummy/";
      do {
        XVar1 = *pXVar4;
        if (XVar1 == L'\0') goto LAB_00106c07;
        pXVar4 = pXVar4 + 1;
        XVar2 = *pXVar9;
        pXVar9 = pXVar9 + 1;
      } while (XVar1 == XVar2);
    }
    plVar5 = (long *)xercesc_4_0::XMLURL::makeNewStream();
    if (plVar5 == (long *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"File ",5);
      pwVar10 = *(wchar16 **)(url + 0x48);
      if (pwVar10 == (wchar16 *)0x0) {
        xercesc_4_0::XMLURL::buildFullText();
        pwVar10 = *(wchar16 **)(url + 0x48);
      }
      pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      local_138[0].fLocalForm = pcVar6;
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1120e8);
      }
      else {
        sVar7 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,sVar7);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," is missing",0xb);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
      std::ostream::put(-0x18);
      std::ostream::flush();
      StrX::~StrX(local_138);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Content of file ",0x10);
      pwVar10 = *(wchar16 **)(url + 0x48);
      if (pwVar10 == (wchar16 *)0x0) {
        xercesc_4_0::XMLURL::buildFullText();
        pwVar10 = *(wchar16 **)(url + 0x48);
      }
      pcVar6 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      local_138[0].fLocalForm = pcVar6;
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1120e8);
      }
      else {
        sVar7 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,sVar7);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
      std::ostream::put(-0x18);
      std::ostream::flush();
      StrX::~StrX(local_138);
      lVar8 = (**(code **)(*plVar5 + 0x18))(plVar5,local_138,0xff);
      while (lVar8 != 0) {
        *(undefined1 *)((long)&local_138[0].fLocalForm + lVar8) = 0;
        uVar11 = 0;
        do {
          iVar3 = xercesc_4_0::XMLString::indexOf
                            ((char *)local_138,'\r',uVar11,
                             xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
          if (iVar3 == -1) break;
          uVar11 = (ulong)iVar3;
          pcVar6 = (char *)((long)&local_138[0].fLocalForm + uVar11 + 1);
          lVar8 = xercesc_4_0::XMLString::stringLen(pcVar6);
          memmove((void *)((long)&local_138[0].fLocalForm + uVar11),pcVar6,lVar8 + 1);
        } while (*(char *)((long)&local_138[0].fLocalForm + uVar11) != '\0');
        sVar7 = strlen((char *)local_138);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,(char *)local_138,sVar7);
        lVar8 = (**(code **)(*plVar5 + 0x18))(plVar5,local_138,0xff);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
      std::ostream::put(-0x18);
      std::ostream::flush();
      (**(code **)(*plVar5 + 8))(plVar5);
    }
  }
  return;
}

Assistant:

void BaseHarnessHandlers::printFile(XMLURL& url)
{
    if(XMLString::equals(url.getURLText(), dummy))
        return;
    BinInputStream* stream=url.makeNewStream();
    if(stream==NULL)
    {
        std::cout << "File " << StrX(url.getURLText()) << " is missing" << std::endl;
        return;
    }
    std::cout << "Content of file " << StrX(url.getURLText()) << std::endl;
    XMLByte buffer[256];
    XMLSize_t nRead;
    while((nRead=stream->readBytes(buffer, 255)) >0)
    {
        buffer[nRead]=0;
        // sending data containing \n\r to cout generates \n\n\r, so strip any \r
        XMLSize_t idx=0;
        while(true)
        {
            int cr=XMLString::indexOf((const char*)buffer, '\r', idx);
            if(cr==-1)
                break;
            memmove(&buffer[cr], &buffer[cr+1], XMLString::stringLen((const char*)&buffer[cr+1])+1);
            idx=cr;
            if(buffer[idx]==0)
                break;
        }
        std::cout << (const char*)buffer;
    }
    std::cout << std::endl;
    delete stream;
}